

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

int mbedtls_internal_sha256_process(mbedtls_sha256_context_conflict *ctx,uchar *data)

{
  uint uVar1;
  long lVar2;
  uint32_t *puVar3;
  ulong uVar4;
  int in_EDX;
  uint uVar5;
  int iVar6;
  uint unaff_R15D;
  uint auStack_190 [80];
  uint local_50 [8];
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    local_50[lVar2] = ctx->state[lVar2];
  }
  puVar3 = K;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if (uVar4 < 0x10) {
      uVar5 = *(uint *)(data + uVar4 * 4);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    else {
      uVar5 = auStack_190[uVar4 + 1];
      uVar1 = auStack_190[uVar4 + 0xe];
      uVar5 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
              auStack_190[uVar4 + 9] + auStack_190[uVar4] +
              (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
    }
    auStack_190[uVar4 + 0x10] = uVar5;
    iVar6 = ((local_50[4] << 7 | local_50[4] >> 0x19) ^
            (local_50[4] << 0x15 | local_50[4] >> 0xb) ^ (local_50[4] << 0x1a | local_50[4] >> 6)) +
            local_50[7] + *puVar3 + ((local_50[5] ^ local_50[6]) & local_50[4] ^ local_50[6]) +
            uVar5;
    in_EDX = ((local_50[1] | local_50[0]) & local_50[2] | local_50[1] & local_50[0]) +
             ((local_50[0] << 10 | local_50[0] >> 0x16) ^
             (local_50[0] << 0x13 | local_50[0] >> 0xd) ^ (local_50[0] << 0x1e | local_50[0] >> 2));
    unaff_R15D = in_EDX + iVar6;
    local_50[7] = local_50[6];
    local_50[6] = local_50[5];
    local_50[5] = local_50[4];
    local_50[4] = iVar6 + local_50[3];
    local_50[3] = local_50[2];
    local_50[2] = local_50[1];
    local_50[1] = local_50[0];
    local_50[0] = unaff_R15D;
    puVar3 = puVar3 + 1;
  }
  auStack_190[0xe] = unaff_R15D;
  auStack_190[0xf] = in_EDX;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    ctx->state[lVar2] = ctx->state[lVar2] + local_50[lVar2];
  }
  auStack_190[0xc] = 0x1f2795;
  auStack_190[0xd] = 0;
  mbedtls_platform_zeroize(auStack_190 + 0xe,0x128);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}